

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O3

uint getRawBit(int value,uint length)

{
  uint uVar1;
  runtime_error *this;
  
  if (length != 0) {
    if (value < 1) {
      uVar1 = 1;
      if (length != 1) {
        uVar1 = 1;
        do {
          uVar1 = uVar1 * 2 + 1;
          length = length - 1;
        } while (1 < length);
      }
      value = value - 1U & uVar1;
    }
    return value;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Error - Length 0 is not allowed");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint getRawBit(int value, uint length) {
	if (length == 0)
		throw std::runtime_error("Error - Length 0 is not allowed");
	uint rawBit;
	if (value > 0) {
		rawBit = value;
	} else {
        uint temp = 1;
        while(length > 1) {
            temp = (temp << 1) + 1;
            length--;
        }
		rawBit = (-value);
		rawBit = (~rawBit) & temp;
	}
	return rawBit;
}